

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# double-conversion.cpp
# Opt level: O1

void icu_63::double_conversion::DoubleToStringConverter::DoubleToAscii
               (double v,DtoaMode mode,int requested_digits,char *buffer,int buffer_length,
               bool *sign,int *length,int *point)

{
  bool bVar1;
  Vector<char> buffer_00;
  Vector<char> buffer_01;
  
  if ((long)v < 0) {
    *sign = true;
    v = -v;
  }
  else {
    *sign = false;
  }
  if (mode == PRECISION && requested_digits == 0) {
    *buffer = '\0';
    *length = 0;
  }
  else if ((v != 0.0) || (NAN(v))) {
    if (mode != SHORTEST) {
      abort();
    }
    buffer_00.start_ = (char *)(ulong)(uint)buffer_length;
    buffer_00._8_8_ = length;
    bVar1 = FastDtoa((double_conversion *)0x0,v,FAST_DTOA_SHORTEST,(int)buffer,buffer_00,point,
                     (int *)v);
    if (!bVar1) {
      buffer_01.start_ = (char *)(ulong)(uint)buffer_length;
      buffer_01._8_8_ = length;
      BignumDtoa((double_conversion *)0x0,v,requested_digits,(int)buffer,buffer_01,point,(int *)v);
      buffer[*length] = '\0';
    }
  }
  else {
    buffer[0] = '0';
    buffer[1] = '\0';
    *length = 1;
    *point = 1;
  }
  return;
}

Assistant:

void DoubleToStringConverter::DoubleToAscii(double v,
                                            DtoaMode mode,
                                            int requested_digits,
                                            char* buffer,
                                            int buffer_length,
                                            bool* sign,
                                            int* length,
                                            int* point) {
  Vector<char> vector(buffer, buffer_length);
  ASSERT(!Double(v).IsSpecial());
  ASSERT(mode == SHORTEST || mode == SHORTEST_SINGLE || requested_digits >= 0);

  if (Double(v).Sign() < 0) {
    *sign = true;
    v = -v;
  } else {
    *sign = false;
  }

  if (mode == PRECISION && requested_digits == 0) {
    vector[0] = '\0';
    *length = 0;
    return;
  }

  if (v == 0) {
    vector[0] = '0';
    vector[1] = '\0';
    *length = 1;
    *point = 1;
    return;
  }

  bool fast_worked;
  switch (mode) {
    case SHORTEST:
      fast_worked = FastDtoa(v, FAST_DTOA_SHORTEST, 0, vector, length, point);
      break;
#if 0 // not needed for ICU
    case SHORTEST_SINGLE:
      fast_worked = FastDtoa(v, FAST_DTOA_SHORTEST_SINGLE, 0,
                             vector, length, point);
      break;
    case FIXED:
      fast_worked = FastFixedDtoa(v, requested_digits, vector, length, point);
      break;
    case PRECISION:
      fast_worked = FastDtoa(v, FAST_DTOA_PRECISION, requested_digits,
                             vector, length, point);
      break;
#endif // not needed for ICU
    default:
      fast_worked = false;
      UNREACHABLE();
  }
  if (fast_worked) return;

  // If the fast dtoa didn't succeed use the slower bignum version.
  BignumDtoaMode bignum_mode = DtoaToBignumDtoaMode(mode);
  BignumDtoa(v, bignum_mode, requested_digits, vector, length, point);
  vector[*length] = '\0';
}